

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_ps.c
# Opt level: O0

MPP_RET h265e_set_sps(H265eCtx *ctx,H265eSps *sps,H265eVps *vps)

{
  byte bVar1;
  MppFrameFormat MVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  MppEncCfgSet *pMVar5;
  MppEncCfgSet *pMVar6;
  MppEncCfgSet *pMVar7;
  MppEncRefCfg ref;
  char cVar8;
  uint uVar9;
  RK_U32 rem_1;
  RK_U32 padsize_1;
  RK_U32 rem;
  RK_U32 padsize;
  RK_U32 *tmp;
  MppEncCpbInfo *pMStack_118;
  RockchipSocType soc_type;
  MppEncCpbInfo *cpb_info;
  RK_U32 local_108;
  RK_S32 tuQTMaxLog2Size;
  RK_S32 tuQTMinLog2Size;
  RK_S32 log2MinCUSize;
  RK_S32 minCUSize;
  RK_S32 pad [2];
  RK_U32 addCUDepth;
  RK_U32 minCUDepth;
  RK_U32 maxCUDepth;
  RK_U8 convertToBit [129];
  RK_S32 i_timebase_den;
  RK_S32 i_timebase_num;
  MppFrameFormat fmt;
  MppEncH265VuiCfg *vui;
  MppEncRefCfg ref_cfg;
  MppEncRcCfg *rc;
  MppEncPrepCfg *prep;
  MppEncH265Cfg *codec;
  RK_U32 c;
  RK_U32 i;
  H265eVps *vps_local;
  H265eSps *sps_local;
  H265eCtx *ctx_local;
  
  pMVar5 = ctx->cfg;
  pMVar6 = ctx->cfg;
  pMVar7 = ctx->cfg;
  ref = ctx->cfg->ref_cfg;
  MVar2 = (pMVar6->prep).format;
  RVar3 = (pMVar7->rc).fps_out_denom;
  RVar4 = (pMVar7->rc).fps_out_num;
  memset(&log2MinCUSize,0,8);
  local_108 = 2;
  pMStack_118 = mpp_enc_ref_cfg_get_cpb_info(ref);
  _rem = sps->zscan2raster;
  memset(&minCUDepth,0xff,0x81);
  cVar8 = '\0';
  for (codec._4_4_ = 4; codec._4_4_ < 0x81; codec._4_4_ = codec._4_4_ << 1) {
    *(char *)((long)&minCUDepth + (ulong)codec._4_4_) = cVar8;
    cVar8 = cVar8 + '\x01';
  }
  bVar1 = *(byte *)((long)&minCUDepth + (long)(pMVar5->codec).field_1.h265.max_cu_size);
  pad[1] = (pMVar5->codec).field_1.h265.max_cu_size >> (bVar1 - 1 & 0x1f);
  cpb_info._4_4_ = *(byte *)((long)&minCUDepth + (long)(pMVar5->codec).field_1.h265.max_cu_size) + 1
  ;
  tmp._4_4_ = mpp_get_soc_type();
  if ((tmp._4_4_ == ROCKCHIP_SOC_RK3576) || (tmp._4_4_ == ROCKCHIP_SOC_RV1126B)) {
    cpb_info._4_4_ = cpb_info._4_4_ + 1;
  }
  pad[0] = 0;
  while ((uint)(1 << ((char)local_108 + (char)pad[0] & 0x1fU)) <
         (uint)((pMVar5->codec).field_1.h265.max_cu_size >> (bVar1 & 0x1f))) {
    pad[0] = pad[0] + 1;
  }
  uVar9 = pad[0] + (uint)bVar1;
  pad[0] = pad[0] + 1;
  init_zscan2raster(uVar9 + 1,1,0,(RK_U32 **)&rem);
  init_raster2zscan((pMVar5->codec).field_1.h264.hw_cfg.hw_poc_type,uVar9 + 1,sps->raster2zscan,
                    sps->zscan2raster);
  init_raster2pelxy((pMVar5->codec).field_1.h264.hw_cfg.hw_poc_type,uVar9 + 1,sps->raster2pelx,
                    sps->raster2pely);
  memset(&sps->m_conformanceWindow,0,0x14);
  if ((uint)(pMVar6->prep).width % (uint)pad[1] != 0) {
    log2MinCUSize = pad[1] - (uint)(pMVar6->prep).width % (uint)pad[1];
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winRightOffset = log2MinCUSize;
  }
  if ((uint)(pMVar6->prep).height % (uint)pad[1] != 0) {
    minCUSize = pad[1] - (uint)(pMVar6->prep).height % (uint)pad[1];
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winBottomOffset = minCUSize;
  }
  sps->m_SPSId = 0;
  sps->m_VPSId = 0;
  sps->m_chromaFormatIdc = (uint)(MVar2 != MPP_FMT_YUV400);
  sps->m_maxTLayers = vps->m_maxLayers;
  sps->m_picWidthInLumaSamples = (pMVar6->prep).width + log2MinCUSize;
  sps->m_picHeightInLumaSamples = (pMVar6->prep).height + minCUSize;
  sps->m_log2MinCodingBlockSize = 0;
  sps->m_log2DiffMaxMinCodingBlockSize = 0;
  sps->m_maxCUSize = (pMVar5->codec).field_1.h264.hw_cfg.hw_poc_type;
  sps->m_maxCUDepth = uVar9;
  sps->m_addCUDepth = pad[0];
  (sps->m_RPSList).m_numberOfReferencePictureSets = 0;
  (sps->m_RPSList).m_referencePictureSets = (H265eReferencePictureSet *)0x0;
  tuQTMaxLog2Size = 0;
  for (tuQTMinLog2Size = sps->m_maxCUSize >> ((char)sps->m_maxCUDepth - (char)pad[0] & 0x1fU);
      1 < tuQTMinLog2Size; tuQTMinLog2Size = tuQTMinLog2Size >> 1) {
    tuQTMaxLog2Size = tuQTMaxLog2Size + 1;
  }
  sps->m_log2MinCodingBlockSize = tuQTMaxLog2Size;
  sps->m_log2DiffMaxMinCodingBlockSize = sps->m_maxCUDepth - pad[0];
  sps->m_pcmLog2MaxSize = 5;
  sps->m_usePCM = 0;
  sps->m_pcmLog2MinSize = 3;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_quadtreeTULog2MaxSize = cpb_info._4_4_;
  sps->m_quadtreeTULog2MinSize = local_108;
  sps->m_quadtreeTUMaxDepthInter = 1;
  sps->m_quadtreeTUMaxDepthIntra = 1;
  sps->m_useLossless = 0;
  for (codec._4_4_ = 0; codec._4_4_ < uVar9 - pad[0]; codec._4_4_ = codec._4_4_ + 1) {
    sps->m_iAMPAcc[codec._4_4_] = (pMVar5->codec).field_1.h264.hw_cfg.hw_split_out;
  }
  sps->m_useAMP = (pMVar5->codec).field_1.h264.hw_cfg.hw_split_out;
  for (codec._4_4_ = uVar9 - pad[0]; codec._4_4_ < uVar9; codec._4_4_ = codec._4_4_ + 1) {
    sps->m_iAMPAcc[codec._4_4_] = (pMVar5->codec).field_1.h264.hw_cfg.hw_split_out;
  }
  sps->m_bitDepthY = 8;
  sps->m_bitDepthC = 8;
  sps->m_qpBDOffsetY = 0;
  sps->m_qpBDOffsetC = 0;
  sps->m_bUseSAO = (pMVar5->codec).field_1.h264.entropy_coding_mode;
  sps->m_bTemporalIdNestingFlag = 1;
  for (codec._4_4_ = 0; codec._4_4_ < sps->m_maxTLayers; codec._4_4_ = codec._4_4_ + 1) {
    sps->m_maxDecPicBuffering[codec._4_4_] = vps->m_maxDecPicBuffering[codec._4_4_];
    sps->m_numReorderPics[codec._4_4_] = vps->m_numReorderPics[codec._4_4_];
  }
  sps->m_pcmBitDepthLuma = 8;
  sps->m_pcmBitDepthChroma = 8;
  sps->m_bPCMFilterDisableFlag = 0;
  sps->m_scalingListEnabledFlag =
       (uint)((pMVar5->codec).field_1.h265.trans_cfg.defalut_ScalingList_enable != 0);
  sps->m_bitsForPOC = 0x10;
  sps->m_numLongTermRefPicSPS = 0;
  sps->m_maxTrSize = 0x20;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_TMVPFlagsPresent = (pMVar5->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
  sps->m_useStrongIntraSmoothing =
       (pMVar5->codec).field_1.h265.cu_cfg.strong_intra_smoothing_enabled_flag;
  if (pMStack_118->max_lt_cnt == 0) {
    if (pMStack_118->max_st_tid != 0) {
      sps->m_TMVPFlagsPresent = 0;
    }
  }
  else {
    sps->m_numLongTermRefPicSPS = pMStack_118->max_lt_cnt;
    sps->m_bLongTermRefsPresent = 1;
    sps->m_TMVPFlagsPresent = 0;
    (pMVar5->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4 = 0;
  }
  if ((pMVar7->rc).drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
    (pMVar5->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4 = 0;
    sps->m_TMVPFlagsPresent = 0;
    (pMVar5->codec).field_1.h264.entropy_coding_mode = 0;
    sps->m_bUseSAO = 0;
  }
  sps->m_ptl = &vps->m_ptl;
  sps->m_vuiParametersPresentFlag = 1;
  if (sps->m_vuiParametersPresentFlag != 0) {
    (sps->vui).m_aspectRatioInfoPresentFlag = 0;
    (sps->vui).m_aspectRatioIdc = 0;
    (sps->vui).m_sarWidth = 0;
    (sps->vui).m_sarHeight = 0;
    (sps->vui).m_overscanInfoPresentFlag = 0;
    (sps->vui).m_overscanAppropriateFlag = 0;
    (sps->vui).m_videoSignalTypePresentFlag = 0;
    (sps->vui).m_videoFormat = 5;
    if ((pMVar6->prep).range == MPP_FRAME_RANGE_JPEG) {
      (sps->vui).m_videoFullRangeFlag = 1;
      (sps->vui).m_videoSignalTypePresentFlag = 1;
    }
    if (((((pMVar6->prep).colorprim < MPP_FRAME_PRI_NB) &&
         ((pMVar6->prep).colorprim != MPP_FRAME_PRI_UNSPECIFIED)) ||
        (((pMVar6->prep).colortrc < MPP_FRAME_TRC_NB &&
         ((pMVar6->prep).colortrc != MPP_FRAME_TRC_UNSPECIFIED)))) ||
       (((pMVar6->prep).color < MPP_FRAME_SPC_NB &&
        ((pMVar6->prep).color != MPP_FRAME_SPC_UNSPECIFIED)))) {
      (sps->vui).m_videoSignalTypePresentFlag = 1;
      (sps->vui).m_colourDescriptionPresentFlag = 1;
      (sps->vui).m_colourPrimaries = (pMVar6->prep).colorprim;
      (sps->vui).m_transferCharacteristics = (pMVar6->prep).colortrc;
      (sps->vui).m_matrixCoefficients = (pMVar6->prep).color;
    }
    (sps->vui).m_chromaLocInfoPresentFlag = 0;
    (sps->vui).m_chromaSampleLocTypeTopField = 0;
    (sps->vui).m_chromaSampleLocTypeBottomField = 0;
    (sps->vui).m_neutralChromaIndicationFlag = 0;
    (sps->vui).m_fieldSeqFlag = 0;
    (sps->vui).m_frameFieldInfoPresentFlag = 0;
    (sps->vui).m_hrdParametersPresentFlag = 0;
    (sps->vui).m_bitstreamRestrictionFlag = 0;
    (sps->vui).m_tilesFixedStructureFlag = 0;
    (sps->vui).m_motionVectorsOverPicBoundariesFlag = 1;
    (sps->vui).m_restrictedRefPicListsFlag = 1;
    (sps->vui).m_minSpatialSegmentationIdc = 0;
    (sps->vui).m_maxBytesPerPicDenom = 2;
    (sps->vui).m_maxBitsPerMinCuDenom = 1;
    (sps->vui).m_log2MaxMvLengthHorizontal = 0xf;
    (sps->vui).m_log2MaxMvLengthVertical = 0xf;
    if ((pMVar5->codec).field_1.h265.vui.vui_aspect_ratio != 0) {
      (sps->vui).m_aspectRatioInfoPresentFlag =
           (uint)((pMVar5->codec).field_1.h265.vui.vui_aspect_ratio != 0);
      (sps->vui).m_aspectRatioIdc = (pMVar5->codec).field_1.h265.vui.vui_aspect_ratio;
    }
    (sps->vui).m_timingInfo.m_timingInfoPresentFlag = 1;
    (sps->vui).m_timingInfo.m_numUnitsInTick = RVar3;
    (sps->vui).m_timingInfo.m_timeScale = RVar4;
  }
  for (codec._4_4_ = 0; codec._4_4_ < 7; codec._4_4_ = codec._4_4_ + 1) {
    sps->m_maxLatencyIncrease[codec._4_4_] = 0;
  }
  memset(sps->m_ltRefPicPocLsbSps,0,0x84);
  memset(sps->m_usedByCurrPicLtSPSFlag,0,0x84);
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_sps(H265eCtx *ctx, H265eSps *sps, H265eVps *vps)
{
    RK_U32 i, c;
    MppEncH265Cfg *codec = &ctx->cfg->codec.h265;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    MppEncRcCfg *rc = &ctx->cfg->rc;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncH265VuiCfg *vui = &codec->vui;
    MppFrameFormat fmt = prep->format;
    RK_S32 i_timebase_num = rc->fps_out_denom;
    RK_S32 i_timebase_den = rc->fps_out_num;
    RK_U8  convertToBit[MAX_CU_SIZE + 1];
    RK_U32 maxCUDepth, minCUDepth, addCUDepth;
    RK_S32 pad[2] = {0};
    RK_S32 minCUSize, log2MinCUSize;
    RK_S32 tuQTMinLog2Size = 2, tuQTMaxLog2Size;
    MppEncCpbInfo *cpb_info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
    RockchipSocType soc_type;
    RK_U32 *tmp = &sps->zscan2raster[0];

    memset(convertToBit, -1, sizeof(convertToBit));
    c = 0;
    for (i = 4; i <= MAX_CU_SIZE; i *= 2) {
        convertToBit[i] = c;
        c++;
    }

    maxCUDepth = (uint32_t)convertToBit[codec->max_cu_size];

    minCUDepth = (codec->max_cu_size >> (maxCUDepth - 1));

    tuQTMaxLog2Size = convertToBit[codec->max_cu_size] + 2 - 1;
    soc_type = mpp_get_soc_type();
    if (soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RV1126B) {
        tuQTMaxLog2Size = tuQTMaxLog2Size + 1;
    }

    addCUDepth = 0;
    while ((RK_U32)(codec->max_cu_size >> maxCUDepth) > (1u << (tuQTMinLog2Size + addCUDepth))) {
        addCUDepth++;
    }

    maxCUDepth += addCUDepth;
    addCUDepth++;
    init_zscan2raster(maxCUDepth + 1, 1, 0, &tmp );
    init_raster2zscan(codec->max_cu_size, maxCUDepth + 1, &sps->raster2zscan[0], &sps->zscan2raster[0]);
    init_raster2pelxy(codec->max_cu_size, maxCUDepth + 1, &sps->raster2pelx[0], &sps->raster2pely[0]);

    memset(&sps->m_conformanceWindow, 0, sizeof(H265eCropInfo));
    if ((prep->width % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->width % minCUDepth;
        padsize = minCUDepth - rem;
        pad[0] = padsize; //pad width

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winRightOffset = pad[0];
    }

    if ((prep->height % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->height % minCUDepth;
        padsize = minCUDepth - rem;
        pad[1] = padsize; //pad height

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winBottomOffset = pad[1];
    }
    // pad[0] = p->sourceWidth - p->oldSourceWidth;
    // pad[1] = p->sourceHeight - p->oldSourceHeight;

    sps->m_SPSId = 0;
    sps->m_VPSId = 0;
    sps->m_chromaFormatIdc = (fmt == MPP_FMT_YUV400) ? H265_CHROMA_400 : H265_CHROMA_420;
    sps->m_maxTLayers = vps->m_maxLayers;
    sps->m_picWidthInLumaSamples = prep->width + pad[0];
    sps->m_picHeightInLumaSamples = prep->height + pad[1];
    sps->m_log2MinCodingBlockSize = 0;
    sps->m_log2DiffMaxMinCodingBlockSize = 0 ;
    sps->m_maxCUSize = codec->max_cu_size;
    sps->m_maxCUDepth = maxCUDepth;
    sps->m_addCUDepth = addCUDepth;
    sps->m_RPSList.m_numberOfReferencePictureSets = 0;
    sps->m_RPSList.m_referencePictureSets = NULL;

    minCUSize = sps->m_maxCUSize >> (sps->m_maxCUDepth - addCUDepth);
    log2MinCUSize = 0;
    while (minCUSize > 1) {
        minCUSize >>= 1;
        log2MinCUSize++;
    }
    sps->m_log2MinCodingBlockSize = log2MinCUSize;
    sps->m_log2DiffMaxMinCodingBlockSize = sps->m_maxCUDepth - addCUDepth;

    sps->m_pcmLog2MaxSize = 5;
    sps->m_usePCM = 0;
    sps->m_pcmLog2MinSize = 3;


    sps->m_bLongTermRefsPresent = 0;
    sps->m_quadtreeTULog2MaxSize =  tuQTMaxLog2Size;
    sps->m_quadtreeTULog2MinSize = tuQTMinLog2Size;
    sps->m_quadtreeTUMaxDepthInter = 1;     //tuQTMaxInterDepth
    sps->m_quadtreeTUMaxDepthIntra = 1;     //tuQTMaxIntraDepth
    sps->m_useLossless = 0;

    for (i = 0; i < (maxCUDepth - addCUDepth); i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }
    sps->m_useAMP = codec->amp_enable;
    for (i = maxCUDepth - addCUDepth; i < maxCUDepth; i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }

    sps->m_bitDepthY = 8;
    sps->m_bitDepthC = 8;
    sps->m_qpBDOffsetY = 0;
    sps->m_qpBDOffsetC = 0;

    sps->m_bUseSAO = codec->sao_enable;
    sps->m_bTemporalIdNestingFlag = 1;

    for (i = 0; i < sps->m_maxTLayers; i++) {
        sps->m_maxDecPicBuffering[i] = vps->m_maxDecPicBuffering[i];
        sps->m_numReorderPics[i] = vps->m_numReorderPics[i];
    }

    sps->m_pcmBitDepthLuma = 8;
    sps->m_pcmBitDepthChroma = 8;

    sps->m_bPCMFilterDisableFlag = 0;
    sps->m_scalingListEnabledFlag = codec->trans_cfg.defalut_ScalingList_enable == 0 ? 0 : 1;

    sps->m_bitsForPOC = 16;
    sps->m_numLongTermRefPicSPS = 0;
    sps->m_maxTrSize = 32;
    sps->m_bLongTermRefsPresent = 0;
    sps->m_TMVPFlagsPresent = codec->tmvp_enable;
    sps->m_useStrongIntraSmoothing = codec->cu_cfg.strong_intra_smoothing_enabled_flag;
    if (cpb_info->max_lt_cnt) {
        sps->m_numLongTermRefPicSPS = cpb_info->max_lt_cnt;
        sps->m_bLongTermRefsPresent = 1;
        sps->m_TMVPFlagsPresent = 0;
        codec->tmvp_enable = 0;
    } else if (cpb_info->max_st_tid) {
        sps->m_TMVPFlagsPresent = 0;
    }

    if (rc->drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
        codec->tmvp_enable = 0;
        sps->m_TMVPFlagsPresent = 0;
        codec->sao_enable = 0;
        sps->m_bUseSAO = 0;
    }

    sps->m_ptl = &vps->m_ptl;
    sps->m_vuiParametersPresentFlag = 1;
    if (sps->m_vuiParametersPresentFlag) {
        sps->vui.m_aspectRatioInfoPresentFlag = 0;
        sps->vui.m_aspectRatioIdc = 0;
        sps->vui.m_sarWidth = 0;
        sps->vui.m_sarHeight = 0;
        sps->vui.m_overscanInfoPresentFlag = 0;
        sps->vui.m_overscanAppropriateFlag = 0;
        sps->vui.m_videoSignalTypePresentFlag = 0;
        sps->vui.m_videoFormat = MPP_FRAME_VIDEO_FMT_UNSPECIFIED;
        if (prep->range == MPP_FRAME_RANGE_JPEG) {
            sps->vui.m_videoFullRangeFlag = 1;
            sps->vui.m_videoSignalTypePresentFlag = 1;
        }

        if ((prep->colorprim <= MPP_FRAME_PRI_JEDEC_P22 &&
             prep->colorprim != MPP_FRAME_PRI_UNSPECIFIED) ||
            (prep->colortrc <= MPP_FRAME_TRC_ARIB_STD_B67 &&
             prep->colortrc != MPP_FRAME_TRC_UNSPECIFIED) ||
            (prep->color <= MPP_FRAME_SPC_ICTCP &&
             prep->color != MPP_FRAME_SPC_UNSPECIFIED)) {
            sps->vui.m_videoSignalTypePresentFlag = 1;
            sps->vui.m_colourDescriptionPresentFlag = 1;
            sps->vui.m_colourPrimaries = prep->colorprim;
            sps->vui.m_transferCharacteristics = prep->colortrc;
            sps->vui.m_matrixCoefficients = prep->color;
        }

        sps->vui.m_chromaLocInfoPresentFlag = 0;
        sps->vui.m_chromaSampleLocTypeTopField = 0;
        sps->vui.m_chromaSampleLocTypeBottomField = 0;
        sps->vui.m_neutralChromaIndicationFlag = 0;
        sps->vui.m_fieldSeqFlag = 0;
        sps->vui.m_frameFieldInfoPresentFlag = 0;
        sps->vui.m_hrdParametersPresentFlag = 0;
        sps->vui.m_bitstreamRestrictionFlag = 0;
        sps->vui.m_tilesFixedStructureFlag = 0;
        sps->vui.m_motionVectorsOverPicBoundariesFlag = 1;
        sps->vui.m_restrictedRefPicListsFlag = 1;
        sps->vui.m_minSpatialSegmentationIdc = 0;
        sps->vui.m_maxBytesPerPicDenom = 2;
        sps->vui.m_maxBitsPerMinCuDenom = 1;
        sps->vui.m_log2MaxMvLengthHorizontal = 15;
        sps->vui.m_log2MaxMvLengthVertical = 15;
        if (vui->vui_aspect_ratio) {
            sps->vui.m_aspectRatioInfoPresentFlag = !!vui->vui_aspect_ratio;
            sps->vui.m_aspectRatioIdc = vui->vui_aspect_ratio;
        }
        sps->vui.m_timingInfo.m_timingInfoPresentFlag = 1;
        sps->vui.m_timingInfo.m_numUnitsInTick = i_timebase_num;
        sps->vui.m_timingInfo.m_timeScale = i_timebase_den;
    }



    for (i = 0; i < MAX_SUB_LAYERS; i++) {
        sps->m_maxLatencyIncrease[i] = 0;
    }
    //  sps->m_scalingList = NULL;
    memset(sps->m_ltRefPicPocLsbSps, 0, sizeof(sps->m_ltRefPicPocLsbSps));
    memset(sps->m_usedByCurrPicLtSPSFlag, 0, sizeof(sps->m_usedByCurrPicLtSPSFlag));
    return 0;
}